

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_uext(BtorSimBitVector *bv,uint32_t len)

{
  BtorSimBitVector *pBVar1;
  
  pBVar1 = btorsim_bv_new(len + bv->width);
  memcpy((void *)((long)pBVar1 + (ulong)bv->len * -4 + (ulong)pBVar1->len * 4 + 8),bv + 1,
         (ulong)bv->len * 4);
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_uext (const BtorSimBitVector *bv, uint32_t len)
{
  assert (bv);
  assert (len > 0);

  BtorSimBitVector *res;

  res = btorsim_bv_new (bv->width + len);
  memcpy (
      res->bits + res->len - bv->len, bv->bits, sizeof (*(bv->bits)) * bv->len);

  assert (rem_bits_zero_dbg (res));
  return res;
}